

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocmat.cpp
# Opt level: O2

void __thiscall TPZPostProcMat::TPZPostProcMat(TPZPostProcMat *this)

{
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMatSingleSpaceT<double>.super_TPZMatSingleSpace = (TPZMatSingleSpace)0x0;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMatInterfaceSingleSpace<double> = (TPZMatInterfaceSingleSpace<double>)0x0;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMaterialT<double>.fForcingFunction._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   &(this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
    ).super_TPZMaterialT<double>.fForcingFunctionPOrder = 0;
  *(undefined8 *)
   ((long)&(this->
           super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
           ).super_TPZMaterialT<double>.fForcingFunction.super__Function_base._M_functor + 8) = 0;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMaterialT<double>.fForcingFunction.super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)
   &(this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
    ).super_TPZMaterialT<double>.super_TPZMaterial.fId = 0;
  *(undefined8 *)
   &(this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
    ).super_TPZMaterialT<double>.fForcingFunction.super__Function_base._M_functor = 0;
  *(undefined8 *)
   &(this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
    ).super_TPZMaterialT<double>.super_TPZMaterial = 0;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMaterialT<double>.super_TPZMaterial.fBigNumber = 0.0;
  TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>::TPZMatBase
            (&this->
              super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
             ,&PTR_PTR_017b36b8);
  *(undefined ***)
   &(this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
    ).super_TPZMaterialT<double>.super_TPZMaterial = &PTR__TPZPostProcMat_017b33d8;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMatSingleSpaceT<double>.super_TPZMatSingleSpace =
       (TPZMatSingleSpace)&PTR__TPZPostProcMat_017b3548;
  (this->super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>).
  super_TPZMatInterfaceSingleSpace<double> =
       (TPZMatInterfaceSingleSpace<double>)&PTR__TPZPostProcMat_017b3638;
  TPZManVector<TPZPostProcVar,_20>::TPZManVector(&this->fVars,0);
  TPZManVector<TPZPostProcVar,_20>::Resize(&this->fVars,0);
  this->fDimension = -1;
  return;
}

Assistant:

TPZPostProcMat::TPZPostProcMat() :TPZRegisterClassId(&TPZPostProcMat::ClassId),TBase()
{
	fVars.Resize(0);	
	fDimension = -1;
}